

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractspinbox.cpp
# Opt level: O0

bool __thiscall QAbstractSpinBox::event(QAbstractSpinBox *this,QEvent *event)

{
  long lVar1;
  byte bVar2;
  Type TVar3;
  QAbstractSpinBoxPrivate *pos;
  ulong uVar4;
  QAbstractSpinBoxPrivate *in_RSI;
  long in_FS_OFFSET;
  QAbstractSpinBoxPrivate *d;
  QEvent *in_stack_000000e8;
  QWidget *in_stack_000000f0;
  QSize *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffb0;
  bool local_29;
  QSize local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pos = d_func((QAbstractSpinBox *)0x68755f);
  TVar3 = QEvent::type((QEvent *)in_RSI);
  if (TVar3 == ApplicationLayoutDirectionChange) {
LAB_00687602:
    (**(code **)(*(long *)&pos->super_QWidgetPrivate + 0x100))();
  }
  else if (TVar3 == ShortcutOverride) {
    uVar4 = (**(code **)(*(long *)&pos->edit->super_QWidget + 0x28))(pos->edit,in_RSI);
    if ((uVar4 & 1) != 0) {
      local_29 = true;
      goto LAB_006876b1;
    }
  }
  else {
    if (TVar3 == InputMethod) {
      bVar2 = (**(code **)(*(long *)&pos->edit->super_QWidget + 0x28))(pos->edit,in_RSI);
      local_29 = (bool)(bVar2 & 1);
      goto LAB_006876b1;
    }
    if (TVar3 == LayoutDirectionChange) goto LAB_00687602;
    if ((TVar3 == FontChange) || (TVar3 == StyleChange)) {
      QSize::QSize(in_stack_ffffffffffffffa0);
      pos->cachedMinimumSizeHint = local_10;
      pos->cachedSizeHint = pos->cachedMinimumSizeHint;
    }
    else if (TVar3 - HoverEnter < 3) {
      QSinglePointEvent::position((QSinglePointEvent *)0x687629);
      QPointF::toPoint((QPointF *)CONCAT44(TVar3,in_stack_ffffffffffffffb0));
      QAbstractSpinBoxPrivate::updateHoverControl(in_RSI,(QPoint *)pos);
    }
  }
  local_29 = QWidget::event(in_stack_000000f0,in_stack_000000e8);
LAB_006876b1:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_29;
}

Assistant:

bool QAbstractSpinBox::event(QEvent *event)
{
    Q_D(QAbstractSpinBox);
    switch (event->type()) {
    case QEvent::FontChange:
    case QEvent::StyleChange:
        d->cachedSizeHint = d->cachedMinimumSizeHint = QSize();
        break;
    case QEvent::ApplicationLayoutDirectionChange:
    case QEvent::LayoutDirectionChange:
        d->updateEditFieldGeometry();
        break;
    case QEvent::HoverEnter:
    case QEvent::HoverLeave:
    case QEvent::HoverMove:
        d->updateHoverControl(static_cast<const QHoverEvent *>(event)->position().toPoint());
        break;
    case QEvent::ShortcutOverride:
        if (d->edit->event(event))
            return true;
        break;
#ifdef QT_KEYPAD_NAVIGATION
    case QEvent::EnterEditFocus:
    case QEvent::LeaveEditFocus:
        if (QApplicationPrivate::keypadNavigationEnabled()) {
            const bool b = d->edit->event(event);
            d->edit->setSelection(d->edit->displayText().size() - d->suffix.size(),0);
            if (event->type() == QEvent::LeaveEditFocus)
                emit editingFinished();
            if (b)
                return true;
        }
        break;
#endif
    case QEvent::InputMethod:
        return d->edit->event(event);
    default:
        break;
    }
    return QWidget::event(event);
}